

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex.c
# Opt level: O1

int wally_hex_verify(char *hex)

{
  ulong uVar1;
  int iVar2;
  ulong uVar3;
  uint uVar4;
  
  if (hex == (char *)0x0) {
    uVar1 = 0;
  }
  else {
    uVar1 = strlen(hex);
  }
  iVar2 = -2;
  if (((uVar1 & 1) == 0 && hex != (char *)0x0) && uVar1 != 0) {
    uVar3 = 0;
    do {
      if (9 < (byte)(hex[uVar3] - 0x30U)) {
        uVar4 = (byte)hex[uVar3] - 0x41;
        if (0x25 < uVar4) {
          return -2;
        }
        if ((0x3f0000003fU >> ((ulong)uVar4 & 0x3f) & 1) == 0) {
          return -2;
        }
      }
      uVar3 = uVar3 + 1;
    } while (uVar1 != uVar3);
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int wally_hex_verify(const char *hex)
{
    return wally_hex_n_verify(hex, hex ? strlen(hex) : 0);
}